

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_std_gain_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix,
                 vector<double,_std::allocator<double>_> *w)

{
  float fVar1;
  pointer pdVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  double dVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  longdouble *in_stack_ffffffffffffff40;
  longdouble local_48;
  
  calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
            ((longdouble *)x,(float *)ix_arr,xmean,(size_t *)st,end,(size_t)sd_arr,(double *)w,
             (vector<double,_std::allocator<double>_> *)&local_48,in_stack_ffffffffffffff40);
  dVar13 = (double)in_ST0;
  sVar4 = ix_arr[st];
  fVar14 = x[sVar4];
  *split_ix = st;
  pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar12 = (longdouble)0;
  uVar3 = st;
  lVar9 = lVar12;
  lVar11 = lVar12;
  lVar10 = (longdouble)(fVar14 - xmean);
  dVar16 = -INFINITY;
  sVar5 = st;
  do {
    while( true ) {
      uVar6 = uVar3;
      if (end <= uVar6) {
        if (dVar16 != -INFINITY) {
          dVar13 = midpoint<float>(x[ix_arr[sVar5]],x[ix_arr[sVar5 + 1]]);
          *split_point = dVar13;
        }
        return dVar16;
      }
      lVar7 = (longdouble)pdVar2[sVar4];
      lVar11 = lVar11 + lVar7;
      lVar8 = (longdouble)(fVar14 - xmean);
      lVar12 = ((lVar8 - lVar12) * lVar7) / lVar11 + lVar12;
      lVar9 = lVar7 * (lVar8 - lVar12) * (lVar8 - lVar10) + lVar9;
      sVar4 = ix_arr[uVar6 + 1];
      fVar1 = x[sVar4];
      lVar10 = lVar12;
      if ((fVar14 != fVar1) || (NAN(fVar14) || NAN(fVar1))) break;
LAB_00265026:
      uVar3 = uVar6 + 1;
      fVar14 = fVar1;
    }
    dVar15 = 0.0;
    if (st != uVar6) {
      dVar15 = (double)SQRT(lVar9 / lVar11);
    }
    if (criterion == Pooled) {
      dVar15 = (double)((longdouble)1 +
                       (longdouble)(-1.0 / dVar13) *
                       (((longdouble)(float)lVar11 / local_48) * (longdouble)dVar15 +
                       ((longdouble)(float)(local_48 - lVar11) / local_48) *
                       (longdouble)sd_arr[(uVar6 + 1) - st]));
    }
    else {
      dVar15 = 1.0 - (dVar15 + sd_arr[(uVar6 + 1) - st]) / (dVar13 + dVar13);
    }
    if ((dVar15 <= dVar16) || (dVar15 <= min_gain)) goto LAB_00265026;
    *split_ix = uVar6;
    uVar3 = uVar6 + 1;
    fVar14 = fVar1;
    dVar16 = dVar15;
    sVar5 = uVar6;
  } while( true );
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, real_t xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix, mapping &restrict w)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, xmean, ix_arr, st, end, sd_arr, w, cumw);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[ix_arr[st]] - xmean;
    double best_gain = -HUGE_VAL;
    ldouble_safe currw = 0;
    double this_sd, this_gain;
    double w_this;
    split_ix = st;

    for (size_t row = st; row < end; row++)
    {
        w_this = w[ix_arr[row]];
        currw += w_this;
        running_mean   += w_this * ((x[ix_arr[row]] - xmean) - running_mean) / currw;
        running_ssq    += w_this * (((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row-st+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}